

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_connection.c
# Opt level: O1

apx_error_t apx_clientConnection_unix_connect(apx_clientSocketConnection_t *self,char *socket_path)

{
  int8_t iVar1;
  apx_error_t aVar2;
  msocket_t *self_00;
  msocket_handler_t local_48;
  
  if (self != (apx_clientSocketConnection_t *)0x0) {
    self_00 = msocket_new('\x01');
    if (self_00 == (msocket_t *)0x0) {
      aVar2 = 2;
    }
    else {
      local_48.tcp_inactivity = (_func_void_uint32_t *)0x0;
      local_48.tcp_accept = (_func_void_void_ptr_msocket_server_tag_ptr_msocket_t_ptr *)0x0;
      local_48.udp_msg = (_func_void_void_ptr_char_ptr_uint16_t_uint8_t_ptr_uint32_t *)0x0;
      local_48.tcp_connected = on_socket_connected;
      local_48.tcp_data = on_socket_data;
      local_48.tcp_disconnected = on_socket_disconnected;
      msocket_set_handler(self_00,&local_48,self);
      self->socket_object = self_00;
      iVar1 = msocket_unix_connect(self_00,socket_path);
      if (iVar1 == '\0') {
        aVar2 = 0;
      }
      else {
        msocket_delete(self_00);
        self->socket_object = (msocket_t *)0x0;
        aVar2 = 0x22;
      }
    }
    return aVar2;
  }
  return 1;
}

Assistant:

apx_error_t apx_clientConnection_unix_connect(apx_clientSocketConnection_t *self, const char *socket_path)
{
   if (self != 0)
   {
      apx_error_t retval = APX_NO_ERROR;
      msocket_t *socket_object = msocket_new(AF_LOCAL);
      if (socket_object != 0)
      {
         int8_t result = 0;
         register_msocket_handler(self, socket_object);
         result = msocket_unix_connect(socket_object, socket_path);
         if (result != 0)
         {
            msocket_delete(socket_object);
            self->socket_object = (SOCKET_TYPE*) 0;
            retval = APX_CONNECTION_ERROR;
         }
         else
         {

         }
      }
      else
      {
         retval = APX_MEM_ERROR;
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}